

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlCreateEntityParserCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  PyObject *pPVar2;
  xmlChar *base;
  xmlChar *ID;
  xmlChar *URL;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  iVar1 = libxml_deprecationWarning("xmlCreateEntityParserCtxt");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT
                      (args,"zzz:xmlCreateEntityParserCtxt",&local_18,&local_20,&local_28);
    if (iVar1 != 0) {
      ctxt = (xmlParserCtxtPtr)xmlCreateEntityParserCtxt(local_18,local_20,local_28);
      pPVar2 = libxml_xmlParserCtxtPtrWrap(ctxt);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlCreateEntityParserCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlParserCtxtPtr c_retval;
    xmlChar * URL;
    xmlChar * ID;
    xmlChar * base;

    if (libxml_deprecationWarning("xmlCreateEntityParserCtxt") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"zzz:xmlCreateEntityParserCtxt", &URL, &ID, &base))
        return(NULL);

    c_retval = xmlCreateEntityParserCtxt(URL, ID, base);
    py_retval = libxml_xmlParserCtxtPtrWrap((xmlParserCtxtPtr) c_retval);
    return(py_retval);
}